

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::MergeFrom(Options *this,Options *from)

{
  uint uVar1;
  void *pvVar2;
  int64 iVar3;
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O2/src/bloaty.pb.cc"
               ,0x336);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->filename_).super_RepeatedPtrFieldBase,
             &(from->filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->base_filename_).super_RepeatedPtrFieldBase,
             &(from->base_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->data_source_).super_RepeatedPtrFieldBase,
             &(from->data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
            (&(this->custom_data_source_).super_RepeatedPtrFieldBase,
             &(from->custom_data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->debug_filename_).super_RepeatedPtrFieldBase,
             &(from->debug_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->source_map_).super_RepeatedPtrFieldBase,
             &(from->source_map_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->disassemble_function_,
                 (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->disassemble_function_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->source_filter_,
                 (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->source_filter_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      this->demangle_ = from->demangle_;
    }
    if ((uVar1 & 8) != 0) {
      this->sort_by_ = from->sort_by_;
    }
    if ((uVar1 & 0x10) != 0) {
      this->verbose_level_ = from->verbose_level_;
    }
    if ((uVar1 & 0x20) != 0) {
      this->dump_raw_map_ = from->dump_raw_map_;
    }
    if ((uVar1 & 0x40) != 0) {
      this->debug_vmaddr_ = from->debug_vmaddr_;
    }
    if ((char)uVar1 < '\0') {
      this->debug_fileoff_ = from->debug_fileoff_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    iVar3 = from->max_rows_per_level_;
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x100;
    this->max_rows_per_level_ = iVar3;
  }
  return;
}

Assistant:

void Options::MergeFrom(const Options& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:bloaty.Options)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  filename_.MergeFrom(from.filename_);
  base_filename_.MergeFrom(from.base_filename_);
  data_source_.MergeFrom(from.data_source_);
  custom_data_source_.MergeFrom(from.custom_data_source_);
  debug_filename_.MergeFrom(from.debug_filename_);
  source_map_.MergeFrom(from.source_map_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _has_bits_[0] |= 0x00000001u;
      disassemble_function_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.disassemble_function_);
    }
    if (cached_has_bits & 0x00000002u) {
      _has_bits_[0] |= 0x00000002u;
      source_filter_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.source_filter_);
    }
    if (cached_has_bits & 0x00000004u) {
      demangle_ = from.demangle_;
    }
    if (cached_has_bits & 0x00000008u) {
      sort_by_ = from.sort_by_;
    }
    if (cached_has_bits & 0x00000010u) {
      verbose_level_ = from.verbose_level_;
    }
    if (cached_has_bits & 0x00000020u) {
      dump_raw_map_ = from.dump_raw_map_;
    }
    if (cached_has_bits & 0x00000040u) {
      debug_vmaddr_ = from.debug_vmaddr_;
    }
    if (cached_has_bits & 0x00000080u) {
      debug_fileoff_ = from.debug_fileoff_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000100u) {
    _internal_set_max_rows_per_level(from._internal_max_rows_per_level());
  }
}